

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

CoverpointSymbol * __thiscall
slang::BumpAllocator::
emplace<slang::ast::CoverpointSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation&>
          (BumpAllocator *this,Compilation *args,
          basic_string_view<char,_std::char_traits<char>_> *args_1,SourceLocation *args_2)

{
  CoverpointSymbol *pCVar1;
  Compilation *in_stack_000001e0;
  CoverpointSymbol *in_stack_000001e8;
  SourceLocation in_stack_000001f0;
  undefined1 in_stack_000001f8 [16];
  size_t in_stack_ffffffffffffffc8;
  size_t in_stack_ffffffffffffffd0;
  BumpAllocator *in_stack_ffffffffffffffd8;
  
  pCVar1 = (CoverpointSymbol *)
           allocate(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  ast::CoverpointSymbol::CoverpointSymbol
            (in_stack_000001e8,in_stack_000001e0,(string_view)in_stack_000001f8,in_stack_000001f0);
  return pCVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }